

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

_Bool my_dread(ang_dir *dir,char *fname,size_t len)

{
  int iVar1;
  char local_4c8 [8];
  char path [1024];
  undefined1 local_c0 [8];
  stat filedata;
  dirent *entry;
  size_t len_local;
  char *fname_local;
  ang_dir *dir_local;
  
  if (dir == (ang_dir *)0x0) {
    __assert_fail("dir != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-file.c"
                  ,0x5da,"_Bool my_dread(ang_dir *, char *, size_t)");
  }
  do {
    filedata.__glibc_reserved[2] = (__syscall_slong_t)readdir((DIR *)dir->d);
    if ((dirent *)filedata.__glibc_reserved[2] == (dirent *)0x0) {
      return false;
    }
    path_build(local_4c8,0x400,dir->dirname,((dirent *)filedata.__glibc_reserved[2])->d_name);
    iVar1 = stat(local_4c8,(stat *)local_c0);
  } while ((iVar1 != 0) ||
          (((dir->only_files & 1U) != 0 && (((uint)filedata.st_nlink & 0xf000) == 0x4000))));
  my_strcpy(fname,(char *)(filedata.__glibc_reserved[2] + 0x13),len);
  return true;
}

Assistant:

bool my_dread(ang_dir *dir, char *fname, size_t len)
{
	struct dirent *entry;
	struct stat filedata;
	char path[1024];

	assert(dir != NULL);

	/* Try reading another entry */
	while (1) {
		entry = readdir(dir->d);
		if (!entry) return false;

		path_build(path, sizeof path, dir->dirname, entry->d_name);
            
		/* Check to see if it exists */
		if (stat(path, &filedata) != 0)
			continue;

		/* Check to see if it's a directory */
		if (dir->only_files && S_ISDIR(filedata.st_mode))
			continue;

		/* We've found something worth returning */
		break;
	}

	/* Copy the filename */
	my_strcpy(fname, entry->d_name, len);

	return true;
}